

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

bool duckdb::RLEAnalyze<duckdb::uhugeint_t>(AnalyzeState *state,Vector *input,idx_t count)

{
  idx_t idx;
  idx_t i;
  idx_t iVar1;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_70);
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    idx = iVar1;
    if ((local_70.sel)->sel_vector != (sel_t *)0x0) {
      idx = (idx_t)(local_70.sel)->sel_vector[iVar1];
    }
    RLEState<duckdb::uhugeint_t>::Update<duckdb::EmptyRLEWriter>
              ((RLEState<duckdb::uhugeint_t> *)(state + 1),(uhugeint_t *)local_70.data,
               &local_70.validity,idx);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
  return true;
}

Assistant:

bool RLEAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &rle_state = state.template Cast<RLEAnalyzeState<T>>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		rle_state.state.Update(data, vdata.validity, idx);
	}
	return true;
}